

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::V0LayerParameter::SharedDtor(V0LayerParameter *this)

{
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->type_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->source_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->meanfile_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->det_crop_mode_,(string *)&_default_det_crop_mode__abi_cxx11_);
  if (this != (V0LayerParameter *)&_V0LayerParameter_default_instance_) {
    if (this->weight_filler_ != (FillerParameter *)0x0) {
      (*(this->weight_filler_->super_Message).super_MessageLite._vptr_MessageLite[1])();
    }
    if (this->bias_filler_ != (FillerParameter *)0x0) {
      (*(this->bias_filler_->super_Message).super_MessageLite._vptr_MessageLite[1])();
    }
    if (this->hdf5_output_param_ != (HDF5OutputParameter *)0x0) {
      (*(this->hdf5_output_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
      return;
    }
  }
  return;
}

Assistant:

void V0LayerParameter::SharedDtor() {
  name_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  type_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  source_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  meanfile_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  det_crop_mode_.DestroyNoArena(&V0LayerParameter::_default_det_crop_mode_.get());
  if (this != internal_default_instance()) {
    delete weight_filler_;
  }
  if (this != internal_default_instance()) {
    delete bias_filler_;
  }
  if (this != internal_default_instance()) {
    delete hdf5_output_param_;
  }
}